

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScrollController.cpp
# Opt level: O3

void __thiscall
Rml::ScrollController::UpdateAutoscroll
          (ScrollController *this,Vector2i mouse_position,float dp_ratio)

{
  code *pcVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  SystemInterface *pSVar4;
  Vector2f target_delta;
  double extraout_XMM0_Qa;
  undefined1 auVar5 [12];
  float fVar6;
  uint uVar8;
  undefined1 in_XMM3 [16];
  undefined1 auVar7 [16];
  Vector2f scroll_length_integral;
  Vector2f local_40;
  undefined1 local_38 [16];
  Vector2f local_28;
  
  local_38._8_8_ = local_38._0_8_;
  uVar8 = in_XMM3._8_4_;
  local_28.x = dp_ratio;
  if ((this->mode != Autoscroll) || (this->target == (Element *)0x0)) {
    bVar3 = Assert("RMLUI_ASSERT(mode == Mode::Autoscroll && target)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ScrollController.cpp"
                   ,0x8a);
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  local_38._0_8_ = this->previous_update_time;
  pSVar4 = GetSystemInterface();
  (*pSVar4->_vptr_SystemInterface[2])(pSVar4);
  this->previous_update_time = extraout_XMM0_Qa;
  fVar6 = (float)(extraout_XMM0_Qa - (double)local_38._0_8_);
  auVar5 = ZEXT812(0x3d888889);
  if (fVar6 <= 0.06666667) {
    auVar5._4_8_ = 0;
    auVar5._0_4_ = fVar6;
  }
  auVar7._0_8_ = (ulong)-(uint)(fVar6 < 0.002) & 0xffffffff3b03126f;
  auVar7._8_8_ = 0;
  auVar2._4_4_ = 0;
  auVar2._0_4_ = ~-(uint)(fVar6 < 0.002) & auVar5._0_4_;
  auVar2._8_4_ = ~uVar8 & auVar5._8_4_;
  auVar2._12_4_ = 0;
  local_38 = auVar7 | auVar2;
  target_delta.x = (float)(mouse_position.x - (this->autoscroll_start_position).x);
  target_delta.y = (float)(mouse_position.y - (this->autoscroll_start_position).y);
  local_28 = CalculateAutoscrollVelocity(target_delta,local_28.x);
  local_40.x = (this->autoscroll_accumulated_length).x + (float)local_38._0_4_ * local_28.x;
  local_40.y = (this->autoscroll_accumulated_length).y + (float)local_38._0_4_ * local_28.y;
  this->autoscroll_accumulated_length = local_40;
  fVar6 = Math::DecomposeFractionalIntegral(local_40.x,&local_40.x);
  (this->autoscroll_accumulated_length).x = fVar6;
  fVar6 = Math::DecomposeFractionalIntegral((this->autoscroll_accumulated_length).y,&local_40.y);
  (this->autoscroll_accumulated_length).y = fVar6;
  if ((((local_28.x != 0.0) || (NAN(local_28.x))) || (local_28.y != 0.0)) || (NAN(local_28.y))) {
    this->autoscroll_moved = true;
  }
  PerformScrollOnTarget(this,local_40);
  return;
}

Assistant:

void ScrollController::UpdateAutoscroll(Vector2i mouse_position, float dp_ratio)
{
	RMLUI_ASSERT(mode == Mode::Autoscroll && target);

	const float dt = UpdateTime();

	const Vector2f scroll_delta = Vector2f(mouse_position - autoscroll_start_position);
	const Vector2f scroll_velocity = CalculateAutoscrollVelocity(scroll_delta, dp_ratio);

	autoscroll_accumulated_length += scroll_velocity * dt;

	// Only submit the integer part of the scroll length, accumulate and store fractional parts to enable sub-pixel-per-frame scrolling speeds.
	Vector2f scroll_length_integral = autoscroll_accumulated_length;
	autoscroll_accumulated_length.x = Math::DecomposeFractionalIntegral(autoscroll_accumulated_length.x, &scroll_length_integral.x);
	autoscroll_accumulated_length.y = Math::DecomposeFractionalIntegral(autoscroll_accumulated_length.y, &scroll_length_integral.y);

	if (scroll_velocity != Vector2f(0.f))
		autoscroll_moved = true;

	PerformScrollOnTarget(scroll_length_integral);
}